

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

void TargetFilesystemArtifactDependencyCMP0112::AddDependency
               (cmGeneratorTarget *target,cmGeneratorExpressionContext *context)

{
  cmLocalGenerator *this;
  cmMakefile *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  string *psVar3;
  cmake *this_01;
  PolicyID extraout_EDX;
  PolicyID extraout_EDX_00;
  PolicyID id;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string err;
  cmGeneratorTarget *local_d0;
  string local_c8;
  string local_a8;
  string local_88;
  char *local_68;
  undefined8 local_60;
  size_type local_58;
  pointer local_50;
  undefined8 local_48;
  undefined8 local_40;
  char *local_38;
  undefined8 local_30;
  
  local_d0 = target;
  std::
  _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
  ::_M_insert_unique<cmGeneratorTarget_const*const&>
            ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
              *)&context->AllTargets,&local_d0);
  this = context->LG;
  PVar2 = cmPolicies::PolicyMap::Get(&local_d0->PolicyMap,CMP0112);
  if (PVar2 != OLD) {
    if (PVar2 != WARN) {
      return;
    }
    this_00 = this->Makefile;
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"CMAKE_POLICY_WARNING_CMP0112","");
    bVar1 = cmMakefile::PolicyOptionalWarningEnabled(this_00,&local_88);
    id = extraout_EDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,(ulong)(local_88.field_2._M_allocated_capacity + 1))
      ;
      id = extraout_EDX_00;
    }
    if (bVar1) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_c8,(cmPolicies *)0x70,id);
      psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(local_d0);
      local_88._M_dataplus._M_p = (pointer)local_c8._M_string_length;
      local_88._M_string_length = (size_type)local_c8._M_dataplus._M_p;
      local_88.field_2._8_8_ = 0x26;
      local_68 = "\nDependency being added to target:\n  \"";
      local_60 = 0;
      local_50 = (psVar3->_M_dataplus)._M_p;
      local_58 = psVar3->_M_string_length;
      local_48 = 0;
      local_40 = 2;
      local_38 = "\"\n";
      local_30 = 0;
      views._M_len = 4;
      views._M_array = (iterator)&local_88;
      local_88.field_2._M_allocated_capacity = (size_type)&local_c8;
      cmCatViews(&local_a8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      this_01 = cmLocalGenerator::GetCMakeInstance(this);
      cmake::IssueMessage(this_01,AUTHOR_WARNING,&local_a8,&context->Backtrace);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  std::
  _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
  ::_M_insert_unique<cmGeneratorTarget*const&>
            ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
              *)&context->DependTargets,&local_d0);
  return;
}

Assistant:

static void AddDependency(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext* context)
  {
    context->AllTargets.insert(target);
    cmLocalGenerator* lg = context->LG;
    switch (target->GetPolicyStatusCMP0112()) {
      case cmPolicies::WARN:
        if (lg->GetMakefile()->PolicyOptionalWarningEnabled(
              "CMAKE_POLICY_WARNING_CMP0112")) {
          std::string err =
            cmStrCat(cmPolicies::GetPolicyWarning(cmPolicies::CMP0112),
                     "\nDependency being added to target:\n  \"",
                     target->GetName(), "\"\n");
          lg->GetCMakeInstance()->IssueMessage(MessageType ::AUTHOR_WARNING,
                                               err, context->Backtrace);
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        context->DependTargets.insert(target);
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        break;
    }
  }